

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void * Node_InheritedVMT(node *p,fourcc_t ClassId)

{
  long local_28;
  nodeclass *Class;
  fourcc_t ClassId_local;
  node *p_local;
  
  local_28 = (long)p->VMT + -0x48;
  while( true ) {
    if (*(fourcc_t *)(local_28 + 0x50) == ClassId) {
      if (*(long *)(local_28 + 0x18) != 0) {
        return (void *)(*(long *)(local_28 + 0x18) + 0x48);
      }
      __assert_fail("Class->ParentClass",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0xafb,"const void *Node_InheritedVMT(node *, fourcc_t)");
    }
    if (*(long *)(local_28 + 0x18) == 0) break;
    local_28 = *(long *)(local_28 + 0x18);
  }
  __assert_fail("Class->ParentClass",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xaf8,"const void *Node_InheritedVMT(node *, fourcc_t)");
}

Assistant:

const void* Node_InheritedVMT(node* p,fourcc_t ClassId)
{
    const nodeclass* Class = NodeGetClass(p);
    while (NodeClass_ClassId(Class) != ClassId)
    {
        assert(Class->ParentClass);
        Class=Class->ParentClass;
    }
    assert(Class->ParentClass);
    return Class->ParentClass+1;
}